

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

void lf::assemble::PrintInfo(ostream *stream,DofHandler *dof_handler,uint ctrl)

{
  Entity *pEVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  undefined4 extraout_var;
  long extraout_RDX;
  long extraout_RDX_00;
  DofHandler *pDVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  shared_ptr<const_lf::mesh::Mesh> mesh;
  char local_75;
  uint local_74;
  DofHandler *local_70;
  ulong local_68;
  uint local_60;
  uint local_5c;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Entity *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  (*dof_handler->_vptr_DofHandler[8])(&local_58);
  uVar2 = (*dof_handler->_vptr_DofHandler[2])(dof_handler);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"DofHandler(",0xb);
  (*dof_handler->_vptr_DofHandler[2])(dof_handler);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," dofs)",6);
  local_70 = dof_handler;
  if (ctrl != 0) {
    local_75 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(stream,&local_75,1);
    local_74 = ctrl;
    local_60 = uVar2;
    if ((ctrl & 1) == 0) {
      local_5c = ctrl % 5;
      local_68 = 0;
      pDVar6 = local_70;
      while( true ) {
        uVar2 = (**(code **)*local_58)();
        if (uVar2 < (uint)local_68) break;
        auVar10 = (**(code **)(*local_58 + 0x10))();
        puVar5 = auVar10._0_8_;
        if (auVar10._8_8_ != 0) {
          local_40 = puVar5 + auVar10._8_8_;
          do {
            pEVar1 = (Entity *)*puVar5;
            local_38 = puVar5;
            (**(code **)(*local_58 + 0x28))(local_58,pEVar1);
            (*pDVar6->_vptr_DofHandler[3])(pDVar6,pEVar1);
            local_48 = pEVar1;
            (*pDVar6->_vptr_DofHandler[5])(pDVar6,pEVar1);
            poVar4 = lf::mesh::operator<<(stream,local_48);
            local_75 = ' ';
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_75,1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," dofs = [",9);
            if (extraout_RDX != 0) {
              lVar9 = 0;
              do {
                poVar4 = std::ostream::_M_insert<long>((long)stream);
                local_75 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_75,1);
                lVar9 = lVar9 + 8;
              } while (extraout_RDX << 3 != lVar9);
            }
            local_75 = ']';
            std::__ostream_insert<char,std::char_traits<char>>(stream,&local_75,1);
            if (local_5c == 0) {
              (*local_70->_vptr_DofHandler[6])(local_70,local_48);
              std::__ostream_insert<char,std::char_traits<char>>(stream," int = [",8);
              if (extraout_RDX_00 != 0) {
                lVar9 = 0;
                do {
                  poVar4 = std::ostream::_M_insert<long>((long)stream);
                  local_75 = ' ';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_75,1);
                  lVar9 = lVar9 + 8;
                } while (extraout_RDX_00 << 3 != lVar9);
              }
              local_75 = ']';
              std::__ostream_insert<char,std::char_traits<char>>(stream,&local_75,1);
            }
            local_75 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(stream,&local_75,1);
            puVar5 = local_38 + 1;
            pDVar6 = local_70;
          } while (puVar5 != local_40);
        }
        local_68 = (ulong)((int)local_68 + 1);
      }
    }
    if ((local_74 * -0x55555555 < 0x55555556) && (local_60 != 0)) {
      uVar8 = (ulong)local_60;
      uVar7 = 0;
      do {
        iVar3 = (*local_70->_vptr_DofHandler[7])(local_70,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"dof ",4);
        poVar4 = std::ostream::_M_insert<long>((long)stream);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
        poVar4 = lf::mesh::operator<<(poVar4,(Entity *)CONCAT44(extraout_var,iVar3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        (**(code **)(*local_58 + 0x28))(local_58,(Entity *)CONCAT44(extraout_var,iVar3));
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        local_75 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_75,1);
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void PrintInfo(std::ostream &stream, const DofHandler &dof_handler,
               unsigned ctrl) {
  // Obtain pointer to the underlying mesh
  auto mesh = dof_handler.Mesh();
  // Number of degrees of freedom managed by the DofHandler object
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());

  stream << "DofHandler(" << dof_handler.NumDofs() << " dofs)";
  if (ctrl > 0) {
    // More detailed output
    stream << '\n';
    if (ctrl % 2 == 0) {
      for (lf::base::dim_t codim = 0; codim <= mesh->DimMesh(); codim++) {
        // Visit all entities of a specific codimension
        for (const lf::mesh::Entity *e : mesh->Entities(codim)) {
          // Fetch unique index of current entity supplied by mesh object
          const lf::base::glb_idx_t e_idx = mesh->Index(*e);
          // Number of shape functions covering current entity
          const lf::assemble::size_type no_dofs(dof_handler.NumLocalDofs(*e));
          // Obtain global indices of those shape functions ...
          const std::span<const gdof_idx_t> doflist(
              dof_handler.GlobalDofIndices(*e));
          // and print them
          stream << *e << ' ' << e_idx << ": " << no_dofs << " dofs = [";
          for (const lf::assemble::gdof_idx_t &dof : doflist) {
            stream << dof << ' ';
          }
          stream << ']';
          if (ctrl % 5 == 0) {
            // Also output indices of interior shape functions
            const std::span<const gdof_idx_t> intdoflist(
                dof_handler.InteriorGlobalDofIndices(*e));
            stream << " int = [";
            for (const lf::assemble::gdof_idx_t int_dof : intdoflist) {
              stream << int_dof << ' ';
            }
            stream << ']';
          }
          stream << '\n';
        }
      }
    }
    if (ctrl % 3 == 0) {
      // List entities associated wit the dofs managed by the current
      // DofHandler object
      for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
        const lf::mesh::Entity &e(dof_handler.Entity(dof_idx));
        stream << "dof " << dof_idx << " -> " << e << " " << mesh->Index(e)
               << '\n';
      }
    }
  }
}